

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::MetaVariable::
set_value<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>
          (MetaVariable *this,
          vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *v)

{
  string local_38 [32];
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *local_18;
  vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *v_local;
  MetaVariable *this_local;
  
  local_18 = v;
  v_local = (vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_> *)this;
  tinyusdz::value::Value::operator=(&this->_value,v);
  ::std::__cxx11::string::string(local_38);
  ::std::__cxx11::string::operator=((string *)&this->_name,local_38);
  ::std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void set_value(const T &v) {
    // TODO: Check T is supported type for Metadatum.
    _value = v;

    _name = std::string();  // empty
  }